

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_map_based.cpp
# Opt level: O1

bool so_5::impl::map_based_subscr_storage::(anonymous_namespace)::
     is_known_mbox_msg_pair<std::map<so_5::impl::map_based_subscr_storage::storage_t::key_t,so_5::impl::map_based_subscr_storage::storage_t::value_t,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>,std::_Rb_tree_iterator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
               (map<so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
                *s,_Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
                   it)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  undefined1 *puVar4;
  
  lVar1 = *(long *)(it._M_node + 1);
  if ((((s->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left != it._M_node) &&
      (lVar3 = std::_Rb_tree_decrement(it._M_node), lVar1 == *(long *)(lVar3 + 0x20))) &&
     (bVar2 = std::type_index::operator==
                        ((type_index *)&it._M_node[1]._M_parent,(type_index *)(lVar3 + 0x28)), bVar2
     )) {
    return true;
  }
  puVar4 = (undefined1 *)std::_Rb_tree_increment(it._M_node);
  if (((_Rb_tree_header *)puVar4 != &(s->_M_t)._M_impl.super__Rb_tree_header) &&
     (lVar1 == *(long *)(puVar4 + 0x20))) {
    bVar2 = std::type_index::operator==
                      ((type_index *)&it._M_node[1]._M_parent,(type_index *)(puVar4 + 0x28));
    return bVar2;
  }
  return false;
}

Assistant:

bool is_known_mbox_msg_pair( M & s, IT it )
		{
			const is_same_mbox_msg predicate{
					it->first.m_mbox_id, it->first.m_msg_type };

			if( it != s.begin() )
				{
					IT prev = it;
					--prev;
					if( predicate( prev->first ) )
						return true;
				}

			IT next = it;
			++next;
			if( next != s.end() )
				return predicate( next->first );

			return false;
		}